

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall rw::World::enumerateLights(World *this,WorldLights *lightData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Light *pLVar4;
  int32 iVar5;
  Light *pLVar6;
  Light *l_1;
  LLLink *lnk_1;
  LLLink *_next_1;
  Light *l;
  LLLink *lnk;
  LLLink *_next;
  int32 maxLocals;
  int32 maxDirectionals;
  WorldLights *lightData_local;
  World *this_local;
  
  iVar1 = lightData->numDirectionals;
  iVar2 = lightData->numLocals;
  lightData->numDirectionals = 0;
  lightData->numLocals = 0;
  lightData->numAmbients = 0;
  (lightData->ambient).red = 0.0;
  (lightData->ambient).green = 0.0;
  (lightData->ambient).blue = 0.0;
  (lightData->ambient).alpha = 1.0;
  l = (Light *)(this->globalLights).link.next;
  while( true ) {
    pLVar4 = *(Light **)&(l->object).object;
    pLVar6 = (Light *)LinkList::end(&this->globalLights);
    if (l == pLVar6) break;
    pLVar6 = Light::fromWorld((LLLink *)l);
    iVar5 = Light::getType(pLVar6);
    l = pLVar4;
    if (iVar5 == 2) {
      (lightData->ambient).red =
           (float32)((float)(pLVar6->color).red + (float)(lightData->ambient).red);
      (lightData->ambient).green =
           (float32)((float)(pLVar6->color).green + (float)(lightData->ambient).green);
      (lightData->ambient).blue =
           (float32)((float)(pLVar6->color).blue + (float)(lightData->ambient).blue);
      lightData->numAmbients = lightData->numAmbients + 1;
    }
    else {
      iVar5 = Light::getType(pLVar6);
      if ((iVar5 == 1) && (lightData->numDirectionals < iVar1)) {
        iVar3 = lightData->numDirectionals;
        lightData->numDirectionals = iVar3 + 1;
        lightData->directionals[iVar3] = pLVar6;
      }
    }
  }
  l_1 = (Light *)(this->localLights).link.next;
  while( true ) {
    pLVar4 = *(Light **)&(l_1->object).object;
    pLVar6 = (Light *)LinkList::end(&this->localLights);
    if ((l_1 == pLVar6) || (iVar2 <= lightData->numLocals)) break;
    pLVar6 = Light::fromWorld((LLLink *)l_1);
    iVar1 = lightData->numLocals;
    lightData->numLocals = iVar1 + 1;
    lightData->locals[iVar1] = pLVar6;
    l_1 = pLVar4;
  }
  return;
}

Assistant:

void
World::enumerateLights(WorldLights *lightData)
{
	int32 maxDirectionals, maxLocals;

	maxDirectionals = lightData->numDirectionals;
	maxLocals = lightData->numLocals;

	lightData->numDirectionals = 0;
	lightData->numLocals = 0;
	lightData->numAmbients = 0;
	lightData->ambient.red = 0.0f;
	lightData->ambient.green = 0.0f;
	lightData->ambient.blue = 0.0f;
	lightData->ambient.alpha = 1.0f;

	FORLIST(lnk, this->globalLights){
		Light *l = Light::fromWorld(lnk);
		if(l->getType() == Light::AMBIENT){
			lightData->ambient.red   += l->color.red;
			lightData->ambient.green += l->color.green;
			lightData->ambient.blue  += l->color.blue;
			lightData->numAmbients++;
		}else if(l->getType() == Light::DIRECTIONAL){
			if(lightData->numDirectionals < maxDirectionals)
				lightData->directionals[lightData->numDirectionals++] = l;
		}
	}

	FORLIST(lnk, this->localLights){
		if(lightData->numLocals >= maxLocals)
			return;

		Light *l = Light::fromWorld(lnk);
		lightData->locals[lightData->numLocals++] = l;
	}
}